

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_all_bvec4(ShaderEvalContext *c)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  Vector<bool,_4> res;
  
  auVar4._4_4_ = -(uint)(0.0 < c->in[0].m_data[2]);
  auVar4._0_4_ = -(uint)(0.0 < c->in[0].m_data[1]);
  auVar4._8_4_ = -(uint)(0.0 < c->in[0].m_data[3]);
  auVar4._12_4_ = -(uint)(0.0 < c->in[0].m_data[0]);
  auVar4 = packssdw(auVar4,auVar4);
  auVar4 = packsswb(auVar4,auVar4);
  if ((byte)(auVar4[0] & DAT_00ae46a0) != 0) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 3) break;
      uVar1 = uVar2 + 1;
    } while (res.m_data[uVar2 + 1] != false);
    if (2 < uVar2) {
      fVar3 = 1.0;
      goto LAB_004b5c3b;
    }
  }
  fVar3 = 0.0;
LAB_004b5c3b:
  (c->color).m_data[0] = fVar3;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }